

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void CheckOperatorName(ExpressionContext *ctx,SynBase *source,InplaceStr name,
                      ArrayView<ArgumentData> argData)

{
  TypeBase *pTVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  char *msg;
  uint uVar6;
  InplaceStr local_50;
  InplaceStr local_40;
  InplaceStr local_30;
  
  local_50.end = name.end;
  local_50.begin = name.begin;
  local_30.begin = "~";
  local_30.end = "";
  bVar2 = InplaceStr::operator==(&local_50,&local_30);
  uVar6 = argData.count;
  if (!bVar2) {
    local_40.begin = "!";
    local_40.end = "";
    bVar2 = InplaceStr::operator==(&local_50,&local_40);
    if (!bVar2) {
      local_30.begin = "+";
      local_30.end = "";
      bVar2 = InplaceStr::operator==(&local_50,&local_30);
      if (!bVar2) {
        local_40.begin = "-";
        local_40.end = "";
        bVar2 = InplaceStr::operator==(&local_50,&local_40);
        if (!bVar2) {
          local_30.begin = "&&";
          local_30.end = "";
          bVar2 = InplaceStr::operator==(&local_50,&local_30);
          if (!bVar2) {
            local_40.begin = "||";
            local_40.end = "";
            bVar2 = InplaceStr::operator==(&local_50,&local_40);
            if (!bVar2) {
              local_30.begin = "()";
              local_30.end = "";
              bVar2 = InplaceStr::operator==(&local_50,&local_30);
              if (bVar2) {
                return;
              }
              local_40.begin = "[]";
              local_40.end = "";
              bVar2 = InplaceStr::operator==(&local_50,&local_40);
              if (uVar6 == 2 || bVar2) {
                return;
              }
              uVar5 = (ulong)(uint)((int)local_50.end - (int)local_50.begin);
              msg = "ERROR: operator \'%.*s\' definition must accept exactly two arguments";
              goto LAB_0017ec32;
            }
          }
          if (((uVar6 == 2) && (pTVar1 = argData.data[1].type, pTVar1 != (TypeBase *)0x0)) &&
             (pTVar1->typeID == 0x15)) {
            lVar3._0_4_ = pTVar1[1].typeID;
            lVar3._4_4_ = pTVar1[1].nameHash;
            if (lVar3 == 0) {
              return;
            }
            iVar4 = 0;
            do {
              lVar3 = *(long *)(lVar3 + 8);
              iVar4 = iVar4 + -1;
            } while (lVar3 != 0);
            if (iVar4 == 0) {
              return;
            }
          }
          uVar5 = (ulong)(uint)((int)local_50.end - (int)local_50.begin);
          msg = 
          "ERROR: operator \'%.*s\' definition must accept a function returning desired type as the second argument"
          ;
          goto LAB_0017ec32;
        }
      }
      if (uVar6 - 1 < 2) {
        return;
      }
      uVar5 = (ulong)(uint)((int)local_50.end - (int)local_50.begin);
      msg = "ERROR: operator \'%.*s\' definition must accept one or two arguments";
      goto LAB_0017ec32;
    }
  }
  if (uVar6 == 1) {
    return;
  }
  uVar5 = (ulong)(uint)((int)local_50.end - (int)local_50.begin);
  msg = "ERROR: operator \'%.*s\' definition must accept exactly one argument";
LAB_0017ec32:
  anon_unknown.dwarf_c6b42::Stop(ctx,source,msg,uVar5);
}

Assistant:

void CheckOperatorName(ExpressionContext &ctx, SynBase *source, InplaceStr name, ArrayView<ArgumentData> argData)
{
	if(name == InplaceStr("~") || name == InplaceStr("!"))
	{
		if(argData.size() != 1)
			Stop(ctx, source, "ERROR: operator '%.*s' definition must accept exactly one argument", FMT_ISTR(name));
	}
	else if(name == InplaceStr("+") || name == InplaceStr("-"))
	{
		if(argData.size() != 1 && argData.size() != 2)
			Stop(ctx, source, "ERROR: operator '%.*s' definition must accept one or two arguments", FMT_ISTR(name));
	}
	else if(name == InplaceStr("&&") || name == InplaceStr("||"))
	{
		// Two arguments with the second argument being special
		if(argData.size() != 2 || !isType<TypeFunction>(argData[1].type) || getType<TypeFunction>(argData[1].type)->arguments.size() != 0)
			Stop(ctx, source, "ERROR: operator '%.*s' definition must accept a function returning desired type as the second argument", FMT_ISTR(name));
	}
	else if(name != InplaceStr("()") && name != InplaceStr("[]"))
	{
		if(argData.size() != 2)
			Stop(ctx, source, "ERROR: operator '%.*s' definition must accept exactly two arguments", FMT_ISTR(name));
	}
}